

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

shared_ptr<chrono::ChSolver> __thiscall chrono::ChSystem::GetSolver(ChSystem *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  _func_int **pp_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  undefined1 auVar3 [16];
  shared_ptr<chrono::ChSolver> sVar4;
  
  if (*(long *)(in_RSI + 0x1e8) != 0) {
    auVar3 = __dynamic_cast(*(long *)(in_RSI + 0x1e8),&ChSolver::typeinfo,
                            &ChIterativeSolver::typeinfo,0xfffffffffffffffe);
    in_RDX._M_pi = auVar3._8_8_;
    if (auVar3._0_8_ != 0) {
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x1f0);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (0.0 < *(double *)(in_RSI + 0x1c8)) {
        *(double *)(auVar3._0_8_ + 0x10) = *(double *)(in_RSI + 0x1c8) * *(double *)(in_RSI + 0x1b0)
        ;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        in_RDX._M_pi = extraout_RDX;
      }
    }
  }
  pp_Var2 = *(_func_int ***)(in_RSI + 0x1f0);
  lVar1 = *(long *)(in_RSI + 0x1f0);
  (this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable =
       *(_func_int ***)(in_RSI + 0x1e8);
  (this->assembly).super_ChPhysicsItem.super_ChObj._vptr_ChObj = pp_Var2;
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  sVar4.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar4.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChSolver>)
         sVar4.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChSolver> ChSystem::GetSolver() {
    // In case the solver is iterative, and if the user specified a force-level tolerance,
    // overwrite the solver's tolerance threshold.
    if (auto iter_solver = std::dynamic_pointer_cast<ChIterativeSolver>(solver)) {
        if (tol_force > 0) {
            iter_solver->SetTolerance(tol_force * step);
        }
    }

    return solver;
}